

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgbaThreading.cpp
# Opt level: O2

void anon_unknown.dwarf_258899::writeReadRGBA
               (char *fileName,int width,int height,Array2D<Imf_3_2::Rgba> *p1,RgbaChannels channels
               ,LineOrder lorder,Compression comp)

{
  uint __line;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  RgbaChannels *pRVar5;
  Box<Imath_3_2::Vec2<int>_> *pBVar6;
  Box<Imath_3_2::Vec2<int>_> *pBVar7;
  float *pfVar8;
  long lVar9;
  half *phVar10;
  int iVar11;
  undefined4 in_register_00000034;
  Array2D<Imf_3_2::Rgba> *src;
  char *pcVar12;
  int width_00;
  half *phVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  Array2D<Imf_3_2::Rgba> p2;
  RgbaOutputFile out;
  half hStack_b6;
  half hStack_b4;
  half hStack_b2;
  float local_78;
  float local_74;
  int local_70;
  Header header;
  
  src = (Array2D<Imf_3_2::Rgba> *)CONCAT44(in_register_00000034,width);
  poVar3 = std::operator<<((ostream *)&std::cout,"channels ");
  pcVar12 = "R";
  if ((height & 1U) == 0) {
    pcVar12 = "";
  }
  poVar3 = std::operator<<(poVar3,pcVar12);
  pcVar12 = "G";
  if ((height & 2U) == 0) {
    pcVar12 = "";
  }
  poVar3 = std::operator<<(poVar3,pcVar12);
  pcVar12 = "B";
  if ((height & 4U) == 0) {
    pcVar12 = "";
  }
  poVar3 = std::operator<<(poVar3,pcVar12);
  pcVar12 = "A";
  if ((height & 8U) == 0) {
    pcVar12 = "";
  }
  poVar3 = std::operator<<(poVar3,pcVar12);
  poVar3 = std::operator<<(poVar3,", line order ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)p1);
  poVar3 = std::operator<<(poVar3,", compression ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,channels);
  std::endl<char,std::char_traits<char>>(poVar3);
  _out = 0;
  hStack_b6._h = 0;
  hStack_b4._h = 0;
  hStack_b2._h = 0;
  Imf_3_2::Header::Header(&header,0xed,0x77,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  piVar4 = (int *)Imf_3_2::Header::lineOrder();
  *piVar4 = (int)p1;
  pRVar5 = (RgbaChannels *)Imf_3_2::Header::compression();
  *pRVar5 = channels;
  remove(fileName);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile(&out,fileName,&header,height,iVar2);
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&out,(ulong)src->_data,1);
  for (iVar2 = 0x77; iVar2 != 0; iVar2 = iVar2 - (int)(fVar17 * (float)iVar2 + 0.5)) {
    fVar17 = (float)Imath_3_2::Rand32::nextf();
    Imf_3_2::RgbaOutputFile::writePixels((int)&out);
  }
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&out);
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,fileName,iVar2);
  piVar4 = (int *)Imf_3_2::RgbaInputFile::dataWindow();
  iVar2 = *piVar4;
  lVar9 = (long)piVar4[2] - (long)iVar2;
  lVar14 = lVar9 + 1;
  iVar11 = piVar4[1];
  lVar16 = (long)piVar4[3] - (long)iVar11;
  lVar15 = lVar16 + 1;
  Imf_3_2::Array2D<Imf_3_2::Rgba>::Array2D(&p2,lVar15,lVar14);
  Imf_3_2::RgbaInputFile::setFrameBuffer
            ((Rgba *)&out,(ulong)(p2._data + (-(long)iVar11 * p2._sizeY - (long)iVar2)),1);
  Imf_3_2::RgbaInputFile::readPixels((int)&out,piVar4[1]);
  pBVar6 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::RgbaInputFile::displayWindow();
  pBVar7 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::displayWindow();
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar6,pBVar7);
  if (bVar1) {
    pBVar6 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::RgbaInputFile::dataWindow();
    pBVar7 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_2::Header::dataWindow();
    bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar6,pBVar7);
    if (bVar1) {
      fVar17 = (float)Imf_3_2::RgbaInputFile::pixelAspectRatio();
      pfVar8 = (float *)Imf_3_2::Header::pixelAspectRatio();
      if ((fVar17 != *pfVar8) || (NAN(fVar17) || NAN(*pfVar8))) {
        pcVar12 = "in.pixelAspectRatio () == header.pixelAspectRatio ()";
        __line = 0x6d;
      }
      else {
        Imf_3_2::RgbaInputFile::screenWindowCenter();
        pfVar8 = (float *)Imf_3_2::Header::screenWindowCenter();
        if ((((local_78 != *pfVar8) || (NAN(local_78) || NAN(*pfVar8))) || (local_74 != pfVar8[1]))
           || (NAN(local_74) || NAN(pfVar8[1]))) {
          pcVar12 = "in.screenWindowCenter () == header.screenWindowCenter ()";
          __line = 0x6e;
        }
        else {
          fVar17 = (float)Imf_3_2::RgbaInputFile::screenWindowWidth();
          pfVar8 = (float *)Imf_3_2::Header::screenWindowWidth();
          if ((fVar17 != *pfVar8) || (NAN(fVar17) || NAN(*pfVar8))) {
            pcVar12 = "in.screenWindowWidth () == header.screenWindowWidth ()";
            __line = 0x6f;
          }
          else {
            iVar2 = Imf_3_2::RgbaInputFile::lineOrder();
            piVar4 = (int *)Imf_3_2::Header::lineOrder();
            if (iVar2 == *piVar4) {
              iVar2 = Imf_3_2::RgbaInputFile::compression();
              piVar4 = (int *)Imf_3_2::Header::compression();
              if (iVar2 == *piVar4) {
                iVar2 = Imf_3_2::RgbaInputFile::channels();
                if (iVar2 == height) {
                  iVar2 = Imf_3_2::RgbaInputFile::compression();
                  width_00 = (int)lVar14;
                  iVar11 = (int)lVar15;
                  if ((iVar2 == 6) || (iVar2 = Imf_3_2::RgbaInputFile::compression(), iVar2 == 7)) {
                    compareB44(width_00,iVar11,src,&p2,height);
                  }
                  else {
                    iVar2 = Imf_3_2::RgbaInputFile::compression();
                    if ((iVar2 == 8) || (iVar2 = Imf_3_2::RgbaInputFile::compression(), iVar2 == 9))
                    {
                      compareDwa(width_00,iVar11,src,&p2,height);
                    }
                    else {
                      local_70 = (int)lVar9;
                      phVar13 = &src->_data->a;
                      phVar10 = &(p2._data)->a;
                      for (lVar14 = 0; lVar14 <= (int)lVar16; lVar14 = lVar14 + 1) {
                        for (lVar15 = 0; lVar15 <= local_70; lVar15 = lVar15 + 1) {
                          fVar17 = *(float *)(_imath_half_to_float_table +
                                             (ulong)phVar10[lVar15 * 4 + -3]._h * 4);
                          if ((height & 1U) == 0) {
                            if ((fVar17 != 0.0) || (NAN(fVar17))) {
                              __assert_fail("p2[y][x].r == 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                            ,0x88,
                                            "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                           );
                            }
                          }
                          else {
                            pfVar8 = (float *)(_imath_half_to_float_table +
                                              (ulong)phVar13[lVar15 * 4 + -3]._h * 4);
                            if ((fVar17 != *pfVar8) || (NAN(fVar17) || NAN(*pfVar8))) {
                              __assert_fail("p2[y][x].r == p1[y][x].r",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                            ,0x86,
                                            "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                           );
                            }
                          }
                          fVar17 = *(float *)(_imath_half_to_float_table +
                                             (ulong)phVar10[lVar15 * 4 + -2]._h * 4);
                          if ((height & 2U) == 0) {
                            if ((fVar17 != 0.0) || (NAN(fVar17))) {
                              __assert_fail("p2[y][x].g == 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                            ,0x8d,
                                            "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                           );
                            }
                          }
                          else {
                            pfVar8 = (float *)(_imath_half_to_float_table +
                                              (ulong)phVar13[lVar15 * 4 + -2]._h * 4);
                            if ((fVar17 != *pfVar8) || (NAN(fVar17) || NAN(*pfVar8))) {
                              __assert_fail("p2[y][x].g == p1[y][x].g",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                            ,0x8b,
                                            "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                           );
                            }
                          }
                          fVar17 = *(float *)(_imath_half_to_float_table +
                                             (ulong)phVar10[lVar15 * 4 + -1]._h * 4);
                          if ((height & 4U) == 0) {
                            if ((fVar17 != 0.0) || (NAN(fVar17))) {
                              __assert_fail("p2[y][x].b == 0",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                            ,0x92,
                                            "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                           );
                            }
                          }
                          else {
                            pfVar8 = (float *)(_imath_half_to_float_table +
                                              (ulong)phVar13[lVar15 * 4 + -1]._h * 4);
                            if ((fVar17 != *pfVar8) || (NAN(fVar17) || NAN(*pfVar8))) {
                              __assert_fail("p2[y][x].b == p1[y][x].b",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                            ,0x90,
                                            "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                           );
                            }
                          }
                          fVar17 = *(float *)(_imath_half_to_float_table +
                                             (ulong)phVar10[lVar15 * 4]._h * 4);
                          if ((height & 8U) == 0) {
                            if ((fVar17 != 1.0) || (NAN(fVar17))) {
                              __assert_fail("p2[y][x].a == 1",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                            ,0x97,
                                            "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                           );
                            }
                          }
                          else {
                            pfVar8 = (float *)(_imath_half_to_float_table +
                                              (ulong)phVar13[lVar15 * 4]._h * 4);
                            if ((fVar17 != *pfVar8) || (NAN(fVar17) || NAN(*pfVar8))) {
                              __assert_fail("p2[y][x].a == p1[y][x].a",
                                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                                            ,0x95,
                                            "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                           );
                            }
                          }
                        }
                        phVar13 = phVar13 + src->_sizeY * 4;
                        phVar10 = phVar10 + p2._sizeY * 4;
                      }
                    }
                  }
                  Imf_3_2::Array2D<Imf_3_2::Rgba>::~Array2D(&p2);
                  Imf_3_2::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
                  remove(fileName);
                  Imf_3_2::Header::~Header(&header);
                  return;
                }
                pcVar12 = "in.channels () == channels";
                __line = 0x72;
              }
              else {
                pcVar12 = "in.compression () == header.compression ()";
                __line = 0x71;
              }
            }
            else {
              pcVar12 = "in.lineOrder () == header.lineOrder ()";
              __line = 0x70;
            }
          }
        }
      }
    }
    else {
      pcVar12 = "in.dataWindow () == header.dataWindow ()";
      __line = 0x6c;
    }
  }
  else {
    pcVar12 = "in.displayWindow () == header.displayWindow ()";
    __line = 0x6b;
  }
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testRgbaThreading.cpp"
                ,__line,
                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
               );
}

Assistant:

void
writeReadRGBA (
    const char           fileName[],
    int                  width,
    int                  height,
    const Array2D<Rgba>& p1,
    RgbaChannels         channels,
    LineOrder            lorder,
    Compression          comp)
{
    //
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the original.
    //

    cout << "channels " << ((channels & WRITE_R) ? "R" : "")
         << ((channels & WRITE_G) ? "G" : "")
         << ((channels & WRITE_B) ? "B" : "")
         << ((channels & WRITE_A) ? "A" : "") << ", line order " << lorder
         << ", compression " << comp << endl;

    Header header (width, height);
    header.lineOrder ()   = lorder;
    header.compression () = comp;

    {
        remove (fileName);
        RgbaOutputFile out (fileName, header, channels);
        out.setFrameBuffer (&p1[0][0], 1, width);

        int numLeft  = height;
        int numWrite = 1;

        //
        // Iterate over all scanlines, and write them out in random-size chunks
        //

        while (numLeft)
        {
            numWrite = int (rand1.nextf () * numLeft + 0.5f);
            out.writePixels (numWrite);
            numLeft -= numWrite;
        }
    }

    {
        RgbaInputFile in (fileName);
        const Box2i&  dw = in.dataWindow ();

        int w  = dw.max.x - dw.min.x + 1;
        int h  = dw.max.y - dw.min.y + 1;
        int dx = dw.min.x;
        int dy = dw.min.y;

        Array2D<Rgba> p2 (h, w);
        in.setFrameBuffer (&p2[-dy][-dx], 1, w);
        in.readPixels (dw.min.y, dw.max.y);

        assert (in.displayWindow () == header.displayWindow ());
        assert (in.dataWindow () == header.dataWindow ());
        assert (in.pixelAspectRatio () == header.pixelAspectRatio ());
        assert (in.screenWindowCenter () == header.screenWindowCenter ());
        assert (in.screenWindowWidth () == header.screenWindowWidth ());
        assert (in.lineOrder () == header.lineOrder ());
        assert (in.compression () == header.compression ());
        assert (in.channels () == channels);

        if (in.compression () == B44_COMPRESSION ||
            in.compression () == B44A_COMPRESSION)
        {
            compareB44 (w, h, p1, p2, channels);
        }
        else if (
            in.compression () == DWAA_COMPRESSION ||
            in.compression () == DWAB_COMPRESSION)
        {
            compareDwa (w, h, p1, p2, channels);
        }
        else
        {
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {
                    if (channels & WRITE_R)
                        assert (p2[y][x].r == p1[y][x].r);
                    else
                        assert (p2[y][x].r == 0);

                    if (channels & WRITE_G)
                        assert (p2[y][x].g == p1[y][x].g);
                    else
                        assert (p2[y][x].g == 0);

                    if (channels & WRITE_B)
                        assert (p2[y][x].b == p1[y][x].b);
                    else
                        assert (p2[y][x].b == 0);

                    if (channels & WRITE_A)
                        assert (p2[y][x].a == p1[y][x].a);
                    else
                        assert (p2[y][x].a == 1);
                }
            }
        }
    }

    remove (fileName);
}